

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_clean_whitespaces_simple(char *str_in)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  
  pcVar3 = str_in + -1;
  do {
    pcVar4 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
  } while (*pcVar4 == ' ');
  while( true ) {
    cVar2 = *pcVar3;
    pcVar4 = pcVar3 + 1;
    cVar5 = cVar2;
    if (cVar2 == ' ') {
      pcVar1 = pcVar3 + 1;
      pcVar4 = pcVar3 + 2;
      pcVar3 = pcVar3 + 1;
      cVar5 = *pcVar1;
    }
    if (cVar5 == '\0') break;
    if (cVar2 == ' ') {
      *str_in = ' ';
      str_in = str_in + 1;
      cVar5 = *pcVar3;
    }
    *str_in = cVar5;
    str_in = str_in + 1;
    pcVar3 = pcVar4;
  }
  *str_in = '\0';
  return;
}

Assistant:

void str_clean_whitespaces_simple(char *str_in)
{
	char *read = str_in;
	char *write = str_in;

	/* skip initial whitespace */
	while(*read == ' ')
		read++;

	/* end of read string is detected in the loop */
	while(1)
	{
		/* skip whitespace */
		int found_whitespace = 0;
		for(; *read == ' ' && !found_whitespace; read++)
			found_whitespace = 1;
		/* if not at the end of the string, put a found whitespace here */
		if(*read)
		{
			if(found_whitespace)
				*write++ = ' ';
			*write++ = *read++;
		}
		else
		{
			*write = 0;
			break;
		}
	}
}